

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int xferCompatibleIndex(Index *pDest,Index *pSrc)

{
  char *zRight;
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = 0;
  if ((pDest->nKeyCol == pSrc->nKeyCol) && (pDest->onError == pSrc->onError)) {
    if (pDest->nKeyCol != 0) {
      lVar2 = 4;
      uVar3 = 0;
      do {
        if (pSrc->aiColumn[uVar3] != pDest->aiColumn[uVar3]) {
          return 0;
        }
        if ((pSrc->aiColumn[uVar3] == -2) &&
           (iVar1 = sqlite3ExprCompare((Parse *)0x0,
                                       *(Expr **)((long)pSrc->aColExpr->a + lVar2 * 2 + -8),
                                       *(Expr **)((long)pDest->aColExpr->a + lVar2 * 2 + -8),-1),
           iVar1 != 0)) {
          return 0;
        }
        if (pSrc->aSortOrder[uVar3] != pDest->aSortOrder[uVar3]) {
          return 0;
        }
        zRight = pDest->azColl[uVar3];
        if (pSrc->azColl[uVar3] == (char *)0x0) {
          iVar1 = -(uint)(zRight != (char *)0x0);
        }
        else {
          if (zRight == (char *)0x0) {
            return 0;
          }
          iVar1 = sqlite3StrICmp(pSrc->azColl[uVar3],zRight);
        }
        if (iVar1 != 0) {
          return 0;
        }
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (uVar3 < pSrc->nKeyCol);
    }
    iVar1 = sqlite3ExprCompare((Parse *)0x0,pSrc->pPartIdxWhere,pDest->pPartIdxWhere,-1);
    uVar4 = (uint)(iVar1 == 0);
  }
  return uVar4;
}

Assistant:

static int xferCompatibleIndex(Index *pDest, Index *pSrc){
  int i;
  assert( pDest && pSrc );
  assert( pDest->pTable!=pSrc->pTable );
  if( pDest->nKeyCol!=pSrc->nKeyCol ){
    return 0;   /* Different number of columns */
  }
  if( pDest->onError!=pSrc->onError ){
    return 0;   /* Different conflict resolution strategies */
  }
  for(i=0; i<pSrc->nKeyCol; i++){
    if( pSrc->aiColumn[i]!=pDest->aiColumn[i] ){
      return 0;   /* Different columns indexed */
    }
    if( pSrc->aiColumn[i]==XN_EXPR ){
      assert( pSrc->aColExpr!=0 && pDest->aColExpr!=0 );
      if( sqlite3ExprCompare(0, pSrc->aColExpr->a[i].pExpr,
                             pDest->aColExpr->a[i].pExpr, -1)!=0 ){
        return 0;   /* Different expressions in the index */
      }
    }
    if( pSrc->aSortOrder[i]!=pDest->aSortOrder[i] ){
      return 0;   /* Different sort orders */
    }
    if( sqlite3_stricmp(pSrc->azColl[i],pDest->azColl[i])!=0 ){
      return 0;   /* Different collating sequences */
    }
  }
  if( sqlite3ExprCompare(0, pSrc->pPartIdxWhere, pDest->pPartIdxWhere, -1) ){
    return 0;     /* Different WHERE clauses */
  }

  /* If no test above fails then the indices must be compatible */
  return 1;
}